

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O0

int colfromatomload(t_atom *colatom)

{
  uint uVar1;
  int iVar2;
  ushort **ppuVar3;
  t_float tVar4;
  uint local_1c;
  int color;
  t_atom *colatom_local;
  
  if (colatom->a_type == A_FLOAT) {
    tVar4 = atom_getfloat(colatom);
    local_1c = (uint)tVar4;
LAB_00146866:
    if ((int)local_1c < 0) {
      uVar1 = -local_1c - 1;
      local_1c = (uVar1 & 0x3f000) << 6 | (uVar1 & 0xfc0) << 4 | (uVar1 & 0x3f) << 2;
    }
    else {
      iVar2 = iemgui_modulo_color(local_1c);
      local_1c = iemgui_color_hex[iVar2];
    }
    colatom_local._4_4_ = local_1c;
  }
  else {
    if (colatom->a_type == A_SYMBOL) {
      ppuVar3 = __ctype_b_loc();
      if ((((*ppuVar3)[(int)*((colatom->a_w).w_symbol)->s_name] & 0x800) != 0) ||
         (*((colatom->a_w).w_symbol)->s_name == '-')) {
        local_1c = atoi(((colatom->a_w).w_symbol)->s_name);
        goto LAB_00146866;
      }
    }
    colatom_local._4_4_ = iemgui_getcolorarg(0,1,colatom);
  }
  return colatom_local._4_4_;
}

Assistant:

static int colfromatomload(t_atom*colatom)
{
    int color;
        /* old-fashioned color argument, either a number or symbol
        evaluating to an integer */
    if (colatom->a_type == A_FLOAT)
        color = atom_getfloat(colatom);
    else if (colatom->a_type == A_SYMBOL &&
        (isdigit(colatom->a_w.w_symbol->s_name[0]) ||
            colatom->a_w.w_symbol->s_name[0] == '-'))
                color = atoi(colatom->a_w.w_symbol->s_name);

        /* symbolic color */
    else return (iemgui_getcolorarg(0, 1, colatom));
    if (color < 0)
    {
        color = -1 - color;
        color = ((color & 0x3f000) << 6)|((color & 0xfc0) << 4)|
            ((color & 0x3f) << 2);
    }
    else
    {
        color = iemgui_modulo_color(color);
        color = iemgui_color_hex[color];
    }
    return (color);
}